

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

bool testing::internal::FindPairing(MatchMatrix *matrix,MatchResultListener *listener)

{
  ostream *poVar1;
  MatchResultListener *pMVar2;
  size_t sVar3;
  ostream *poVar4;
  pointer ppVar5;
  ostream *os;
  ulong uVar6;
  char *__s;
  ElementMatcherPairs matches;
  char *sep;
  ElementMatcherPairs local_60;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  FindMaxBipartiteMatching(&local_60,matrix);
  local_48 = (long)local_60.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_38 = *(ulong *)(matrix + 8);
  if (local_48 == local_38) {
    if (((1 < local_48) && (*(long *)(listener + 8) != 0)) &&
       (local_40 = "where:\n",
       local_60.
       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       local_60.
       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      uVar6 = 0;
      do {
        pMVar2 = MatchResultListener::operator<<(listener,&local_40);
        pMVar2 = MatchResultListener::operator<<(pMVar2,(char (*) [13])" - element #");
        if (*(ulong *)(pMVar2 + 8) != 0) {
          std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar2 + 8));
        }
        pMVar2 = MatchResultListener::operator<<(pMVar2,(char (*) [25])" is matched by matcher #");
        if (*(ulong *)(pMVar2 + 8) != 0) {
          std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar2 + 8));
        }
        local_40 = ",\n";
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)local_60.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_60.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
  }
  else if (*(long *)(listener + 8) != 0) {
    pMVar2 = MatchResultListener::operator<<
                       (listener,(char (*) [89])
                                 "where no permutation of the elements can satisfy all matchers, and the closest match is "
                       );
    if (*(ulong *)(pMVar2 + 8) != 0) {
      std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar2 + 8));
    }
    pMVar2 = MatchResultListener::operator<<(pMVar2,(char (*) [5])0x12d2c6);
    if (*(ulong *)(pMVar2 + 8) != 0) {
      std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar2 + 8));
    }
    MatchResultListener::operator<<(pMVar2,(char (*) [30])" matchers with the pairings:\n");
    poVar1 = *(ostream **)(listener + 8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{",1);
    if (local_60.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_60.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar5 = local_60.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __s = "";
      do {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n  (",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"element #",9);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"matcher #",9);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        ppVar5 = ppVar5 + 1;
        __s = ",";
      } while (ppVar5 != local_60.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n}",2);
  }
  if (local_60.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_48 == local_38;
}

Assistant:

GTEST_API_ bool FindPairing(const MatchMatrix& matrix,
                            MatchResultListener* listener) {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  bool result = (max_flow == matrix.RhsSize());

  if (!result) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can "
                   "satisfy all matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char *sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}